

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Performance::anon_unknown_1::
BasicUploadCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>::deinit
          (BasicUploadCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>
           *this)

{
  int iVar1;
  undefined4 extraout_var;
  void *local_28;
  undefined8 uStack_20;
  long local_18;
  
  if (this->m_dummyBufferID != 0) {
    iVar1 = (*((this->
               super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>
               ).super_TestCase.m_context)->m_renderCtx->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var,iVar1) + 0x438))(1,&this->m_dummyBufferID);
    this->m_dummyBufferID = 0;
  }
  local_28 = (void *)0x0;
  uStack_20 = 0;
  local_18 = 0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
            (&this->m_zeroData,&local_28);
  if (local_28 != (void *)0x0) {
    operator_delete(local_28,local_18 - (long)local_28);
  }
  BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>::deinit
            (&this->
              super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>
            );
  return;
}

Assistant:

void BasicUploadCase<SampleType>::deinit (void)
{
	if (m_dummyBufferID)
	{
		m_context.getRenderContext().getFunctions().deleteBuffers(1, &m_dummyBufferID);
		m_dummyBufferID = 0;
	}

	m_zeroData = std::vector<deUint8>();

	BasicBufferCase<SampleType>::deinit();
}